

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.c
# Opt level: O1

void gai_iterator_reset(_iterator_hdl *hdl)

{
  short sVar1;
  long lVar2;
  global_array_t *pgVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  pgVar3 = GA;
  lVar2 = hdl->g_a;
  if ((uint)GA[lVar2 + 1000].distr_type < 5) {
    switch(GA[lVar2 + 1000].distr_type) {
    case 0:
      hdl->count = 0;
      break;
    case 1:
      hdl->offset = 0;
      hdl->iproc = 0;
      hdl->iblock = 0;
      break;
    case 2:
      hdl->offset = 0;
      hdl->iproc = 0;
      sVar1 = pgVar3[lVar2 + 1000].ndim;
      lVar7 = (long)sVar1;
      hdl->proc_index[0] = 0;
      if (1 < lVar7) {
        lVar5 = hdl->proc_index[0];
        lVar6 = 0;
        lVar4 = 0;
        do {
          lVar4 = (lVar4 - lVar5) / (long)pgVar3[lVar2 + 1000].nblock[lVar6];
          lVar5 = lVar4 % (long)pgVar3[lVar2 + 1000].nblock[lVar6 + 1];
          hdl->proc_index[lVar6 + 1] = lVar5;
          lVar6 = lVar6 + 1;
        } while (lVar7 + -1 != lVar6);
      }
      hdl->index[0] = 0;
      if (1 < sVar1) {
        lVar5 = hdl->index[0];
        lVar6 = 0;
        lVar4 = 0;
        do {
          lVar4 = (lVar4 - lVar5) / (long)pgVar3[lVar2 + 1000].nblock[lVar6];
          lVar5 = lVar4 % (long)pgVar3[lVar2 + 1000].nblock[lVar6 + 1];
          hdl->index[lVar6 + 1] = lVar5;
          lVar6 = lVar6 + 1;
        } while (lVar7 + -1 != lVar6);
      }
      break;
    default:
      hdl->offset = 0;
      hdl->iproc = 0;
      sVar1 = pgVar3[lVar2 + 1000].ndim;
      lVar7 = (long)sVar1;
      hdl->proc_index[0] = 0;
      if (1 < lVar7) {
        lVar5 = hdl->proc_index[0];
        lVar6 = 0;
        lVar4 = 0;
        do {
          lVar4 = (lVar4 - lVar5) / (long)pgVar3[lVar2 + 1000].nblock[lVar6];
          lVar5 = lVar4 % (long)pgVar3[lVar2 + 1000].nblock[lVar6 + 1];
          hdl->proc_index[lVar6 + 1] = lVar5;
          lVar6 = lVar6 + 1;
        } while (lVar7 + -1 != lVar6);
      }
      hdl->index[0] = 0;
      if (1 < sVar1) {
        lVar5 = hdl->index[0];
        lVar6 = 0;
        lVar4 = 0;
        do {
          lVar4 = (lVar4 - lVar5) / (long)pgVar3[lVar2 + 1000].nblock[lVar6];
          lVar5 = lVar4 % (long)pgVar3[lVar2 + 1000].nblock[lVar6 + 1];
          hdl->index[lVar6 + 1] = lVar5;
          lVar6 = lVar6 + 1;
        } while (lVar7 + -1 != lVar6);
      }
    }
  }
  return;
}

Assistant:

void gai_iterator_reset(_iterator_hdl *hdl)
{
  Integer handle = GA_OFFSET + hdl->g_a;
  if (GA[handle].distr_type == REGULAR) {
    /* Regular data distribution */
    hdl->count = 0;
  } else if (GA[handle].distr_type == BLOCK_CYCLIC) {
    /* simple block cyclic data distribution */
    hdl->iproc = 0;
    hdl->iblock = 0;
    hdl->offset = 0;
  } else if (GA[handle].distr_type == SCALAPACK) {
    hdl->iproc = 0;
    hdl->offset = 0;
    /* Initialize proc_index and index arrays */
    gam_find_proc_indices(handle, hdl->iproc, hdl->proc_index);
    gam_find_proc_indices(handle, hdl->iproc, hdl->index);
  } else if (GA[handle].distr_type == TILED ||
      GA[handle].distr_type == TILED_IRREG)  {
    hdl->iproc = 0;
    hdl->offset = 0;
    /* Initialize proc_index and index arrays */
    gam_find_tile_proc_indices(handle, hdl->iproc, hdl->proc_index);
    gam_find_tile_proc_indices(handle, hdl->iproc, hdl->index);
  }
}